

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::ConsumerIPCService::ChangeTraceConfig
          (ConsumerIPCService *this,ChangeTraceConfigRequest *req,
          DeferredChangeTraceConfigResponse *resp)

{
  ConsumerEndpoint *pCVar1;
  RemoteConsumer *pRVar2;
  AsyncResult<perfetto::protos::gen::ChangeTraceConfigResponse> local_20;
  
  pRVar2 = GetConsumerForCurrentRequest(this);
  pCVar1 = (pRVar2->service_endpoint)._M_t.
           super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
           .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl;
  (*pCVar1->_vptr_ConsumerEndpoint[3])
            (pCVar1,(req->trace_config_).ptr_._M_t.
                    super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
                    .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_*,_false>._M_head_impl
            );
  ipc::AsyncResult<perfetto::protos::gen::ChangeTraceConfigResponse>::Create();
  ipc::Deferred<perfetto::protos::gen::ChangeTraceConfigResponse>::Resolve(resp,&local_20);
  if (local_20.msg_._M_t.
      super___uniq_ptr_impl<perfetto::protos::gen::ChangeTraceConfigResponse,_std::default_delete<perfetto::protos::gen::ChangeTraceConfigResponse>_>
      ._M_t.
      super__Tuple_impl<0UL,_perfetto::protos::gen::ChangeTraceConfigResponse_*,_std::default_delete<perfetto::protos::gen::ChangeTraceConfigResponse>_>
      .super__Head_base<0UL,_perfetto::protos::gen::ChangeTraceConfigResponse_*,_false>._M_head_impl
      != (__uniq_ptr_impl<perfetto::protos::gen::ChangeTraceConfigResponse,_std::default_delete<perfetto::protos::gen::ChangeTraceConfigResponse>_>
          )0x0) {
    (**(code **)(*(long *)local_20.msg_._M_t.
                          super___uniq_ptr_impl<perfetto::protos::gen::ChangeTraceConfigResponse,_std::default_delete<perfetto::protos::gen::ChangeTraceConfigResponse>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_perfetto::protos::gen::ChangeTraceConfigResponse_*,_std::default_delete<perfetto::protos::gen::ChangeTraceConfigResponse>_>
                          .
                          super__Head_base<0UL,_perfetto::protos::gen::ChangeTraceConfigResponse_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void ConsumerIPCService::ChangeTraceConfig(
    const protos::gen::ChangeTraceConfigRequest& req,
    DeferredChangeTraceConfigResponse resp) {
  RemoteConsumer* remote_consumer = GetConsumerForCurrentRequest();
  remote_consumer->service_endpoint->ChangeTraceConfig(req.trace_config());
  resp.Resolve(
      ipc::AsyncResult<protos::gen::ChangeTraceConfigResponse>::Create());
}